

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void statement(LexState *ls)

{
  int iVar1;
  int iVar2;
  TString *name;
  int line;
  LexState *ls_local;
  
  iVar2 = ls->linenumber;
  luaE_incCstack(ls->L);
  iVar1 = (ls->t).token;
  if (iVar1 == 0x3b) {
    luaX_next(ls);
  }
  else if (iVar1 == 0x101) {
    breakstat(ls);
  }
  else if (iVar1 == 0x102) {
    luaX_next(ls);
    block(ls);
    check_match(ls,0x105,0x102,iVar2);
  }
  else if (iVar1 == 0x107) {
    forstat(ls,iVar2);
  }
  else if (iVar1 == 0x108) {
    funcstat(ls,iVar2);
  }
  else if (iVar1 == 0x109) {
    luaX_next(ls);
    gotostat(ls);
  }
  else if (iVar1 == 0x10a) {
    ifstat(ls,iVar2);
  }
  else if (iVar1 == 0x10c) {
    luaX_next(ls);
    iVar2 = testnext(ls,0x108);
    if (iVar2 == 0) {
      localstat(ls);
    }
    else {
      localfunc(ls);
    }
  }
  else if (iVar1 == 0x110) {
    repeatstat(ls,iVar2);
  }
  else if (iVar1 == 0x111) {
    luaX_next(ls);
    retstat(ls);
  }
  else if (iVar1 == 0x115) {
    whilestat(ls,iVar2);
  }
  else if (iVar1 == 0x11f) {
    luaX_next(ls);
    name = str_checkname(ls);
    labelstat(ls,name,iVar2);
  }
  else {
    exprstat(ls);
  }
  iVar2 = luaY_nvarstack(ls->fs);
  ls->fs->freereg = (lu_byte)iVar2;
  ls->L->nCcalls = ls->L->nCcalls - 1;
  return;
}

Assistant:

static void statement (LexState *ls) {
  int line = ls->linenumber;  /* may be needed for error messages */
  enterlevel(ls);
  switch (ls->t.token) {
    case ';': {  /* stat -> ';' (empty statement) */
      luaX_next(ls);  /* skip ';' */
      break;
    }
    case TK_IF: {  /* stat -> ifstat */
      ifstat(ls, line);
      break;
    }
    case TK_WHILE: {  /* stat -> whilestat */
      whilestat(ls, line);
      break;
    }
    case TK_DO: {  /* stat -> DO block END */
      luaX_next(ls);  /* skip DO */
      block(ls);
      check_match(ls, TK_END, TK_DO, line);
      break;
    }
    case TK_FOR: {  /* stat -> forstat */
      forstat(ls, line);
      break;
    }
    case TK_REPEAT: {  /* stat -> repeatstat */
      repeatstat(ls, line);
      break;
    }
    case TK_FUNCTION: {  /* stat -> funcstat */
      funcstat(ls, line);
      break;
    }
    case TK_LOCAL: {  /* stat -> localstat */
      luaX_next(ls);  /* skip LOCAL */
      if (testnext(ls, TK_FUNCTION))  /* local function? */
        localfunc(ls);
      else
        localstat(ls);
      break;
    }
    case TK_DBCOLON: {  /* stat -> label */
      luaX_next(ls);  /* skip double colon */
      labelstat(ls, str_checkname(ls), line);
      break;
    }
    case TK_RETURN: {  /* stat -> retstat */
      luaX_next(ls);  /* skip RETURN */
      retstat(ls);
      break;
    }
    case TK_BREAK: {  /* stat -> breakstat */
      breakstat(ls);
      break;
    }
    case TK_GOTO: {  /* stat -> 'goto' NAME */
      luaX_next(ls);  /* skip 'goto' */
      gotostat(ls);
      break;
    }
    default: {  /* stat -> func | assignment */
      exprstat(ls);
      break;
    }
  }
  lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
             ls->fs->freereg >= luaY_nvarstack(ls->fs));
  ls->fs->freereg = luaY_nvarstack(ls->fs);  /* free registers */
  leavelevel(ls);
}